

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

AV1_COMP *
av1_create_compressor
          (AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf,BufferPool *pool,COMPRESSOR_STAGE stage,
          int lap_lag_in_frames)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  aom_enc_pass aVar4;
  AV1_PRIMARY *pAVar5;
  SequenceHeader *pSVar6;
  FIRSTPASS_STATS *ext_stats_buf;
  undefined1 auVar7 [16];
  int iVar8;
  AV1_COMP *cpi_00;
  aom_internal_error_info *paVar9;
  code *pcVar10;
  FRAME_CONTEXT *pFVar11;
  int32_t *piVar12;
  uint8_t *puVar13;
  long lVar14;
  void *pvVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  size_t num;
  bool bVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  AV1_COMP *cpi;
  AV1_COMMON *cm;
  
  cpi_00 = (AV1_COMP *)aom_memalign(0x20,0x9d710);
  if (cpi_00 != (AV1_COMP *)0x0) {
    memset(cpi_00,0,0x9d710);
    cpi_00->ppi = ppi;
    (cpi_00->common).seq_params = &ppi->seq_params;
    paVar9 = (aom_internal_error_info *)aom_calloc(1,0x1a0);
    (cpi_00->common).error = paVar9;
    if ((cpi_00->common).error == (aom_internal_error_info *)0x0) {
      aom_free(cpi_00);
    }
    else {
      iVar8 = _setjmp((__jmp_buf_tag *)((cpi_00->common).error)->jmp);
      paVar9 = (cpi_00->common).error;
      if (iVar8 == 0) {
        paVar9->setjmp = 1;
        cpi_00->compressor_stage = stage;
        cpi_00->do_frame_data_update = true;
        (cpi_00->common).mi_params.free_mi = enc_free_mi;
        (cpi_00->common).mi_params.setup_mi = enc_setup_mi;
        if (oxcf->pass == AOM_RC_FIRST_PASS) {
          pcVar10 = stat_stage_set_mb_mi;
        }
        else {
          pcVar10 = enc_set_mb_mi;
          if (cpi_00->compressor_stage == '\x01') {
            pcVar10 = stat_stage_set_mb_mi;
          }
        }
        (cpi_00->common).mi_params.set_mb_mi = pcVar10;
        (cpi_00->common).mi_params.mi_alloc_bsize = BLOCK_4X4;
        pFVar11 = (FRAME_CONTEXT *)aom_memalign(0x20,0x52fc);
        (cpi_00->common).fc = pFVar11;
        if ((cpi_00->common).fc == (FRAME_CONTEXT *)0x0) {
          aom_internal_error((cpi_00->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->fc")
          ;
        }
        pFVar11 = (FRAME_CONTEXT *)aom_memalign(0x20,0x52fc);
        (cpi_00->common).default_frame_context = pFVar11;
        if ((cpi_00->common).default_frame_context == (FRAME_CONTEXT *)0x0) {
          aom_internal_error((cpi_00->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cm->default_frame_context");
        }
        memset((cpi_00->common).fc,0,0x52fc);
        memset((cpi_00->common).default_frame_context,0,0x52fc);
        (cpi_00->common).buffer_pool = pool;
        memcpy(&cpi_00->oxcf,oxcf,0x480);
        cpi_00->framerate = (oxcf->input_cfg).init_framerate;
        iVar8 = (oxcf->frm_dim_cfg).height;
        (cpi_00->common).width = (oxcf->frm_dim_cfg).width;
        (cpi_00->common).height = iVar8;
        cpi_00->is_dropped_frame = false;
        alloc_compressor_data(cpi_00);
        iVar8 = (cpi_00->common).height;
        cpi_00->data_alloc_width = (cpi_00->common).width;
        cpi_00->data_alloc_height = iVar8;
        cpi_00->frame_size_related_setup_done = false;
        (cpi_00->td).counts = &cpi_00->counts;
        (cpi_00->svc).number_spatial_layers = 1;
        (cpi_00->svc).number_temporal_layers = 1;
        lVar17 = 0;
        (cpi_00->common).temporal_layer_id = 0;
        (cpi_00->common).spatial_layer_id = 0;
        pAVar5 = cpi_00->ppi;
        (pAVar5->rtc_ref).ref_frame_comp[2] = 0;
        (pAVar5->rtc_ref).set_ref_frame_config = 0;
        (pAVar5->rtc_ref).non_reference_frame = 0;
        (pAVar5->rtc_ref).ref_frame_comp[0] = 0;
        (pAVar5->rtc_ref).ref_frame_comp[1] = 0;
        av1_change_config(cpi_00,oxcf,false);
        cpi_00->ref_frame_flags = 0;
        (cpi_00->resize_pending_params).width = 0;
        (cpi_00->resize_pending_params).height = 0;
        av1_setup_scale_factors_for_frame(&(cpi_00->common).sf_identity,1,1,1,1);
        iVar8 = 0;
        iVar22 = 1;
        iVar24 = 2;
        iVar25 = 3;
        do {
          piVar1 = (cpi_00->common).remapped_ref_idx + lVar17;
          *piVar1 = iVar8;
          piVar1[1] = iVar22;
          piVar1[2] = iVar24;
          piVar1[3] = iVar25;
          lVar17 = lVar17 + 4;
          iVar8 = iVar8 + 4;
          iVar22 = iVar22 + 4;
          iVar24 = iVar24 + 4;
          iVar25 = iVar25 + 4;
        } while (lVar17 != 8);
        (cpi_00->force_intpel_info).rate_index = 0;
        (cpi_00->force_intpel_info).rate_size = 0;
        av1_noise_estimate_init
                  (&cpi_00->noise_estimate,(cpi_00->common).width,(cpi_00->common).height);
        if (cpi_00->compressor_stage == '\x01') {
          (cpi_00->oxcf).gf_cfg.lag_in_frames = lap_lag_in_frames;
        }
        av1_rc_init(&cpi_00->oxcf,&cpi_00->rc);
        pSVar6 = (cpi_00->common).seq_params;
        iVar22 = (cpi_00->common).mi_params.mi_rows;
        iVar24 = (cpi_00->common).mi_params.mi_cols;
        iVar8 = (cpi_00->common).height;
        (cpi_00->frame_info).frame_width = (cpi_00->common).width;
        (cpi_00->frame_info).frame_height = iVar8;
        (cpi_00->frame_info).mi_rows = iVar22;
        (cpi_00->frame_info).mi_cols = iVar24;
        iVar8 = (cpi_00->common).mi_params.mb_cols;
        (cpi_00->frame_info).mb_rows = (cpi_00->common).mi_params.mb_rows;
        (cpi_00->frame_info).mb_cols = iVar8;
        (cpi_00->frame_info).num_mbs = (cpi_00->common).mi_params.MBs;
        (cpi_00->frame_info).bit_depth = pSVar6->bit_depth;
        iVar8 = pSVar6->subsampling_y;
        (cpi_00->frame_info).subsampling_x = pSVar6->subsampling_x;
        (cpi_00->frame_info).subsampling_y = iVar8;
        (cpi_00->frame_index_set).show_frame_count = 0;
        (cpi_00->common).current_frame.frame_number = 0;
        (cpi_00->rc).frame_number_encoded = 0;
        (cpi_00->rc).prev_frame_is_dropped = 0;
        (cpi_00->rc).max_consec_drop = 0x7fffffff;
        (cpi_00->rc).drop_count_consec = 0;
        (cpi_00->common).current_frame_id = -1;
        cpi_00->tile_data = (TileDataEnc *)0x0;
        cpi_00->last_show_frame_buf = (RefCntBuffer *)0x0;
        realloc_segmentation_maps(cpi_00);
        (cpi_00->refresh_frame).alt_ref_frame = false;
        (cpi_00->time_stamps).first_ts_start = 0x7fffffffffffffff;
        aVar4 = (cpi_00->oxcf).pass;
        if ((AOM_RC_FIRST_PASS < aVar4) ||
           (((aVar4 == AOM_RC_ONE_PASS && (cpi_00->compressor_stage == '\0')) &&
            (cpi_00->ppi->lap_enabled != 0)))) {
          if (cpi_00->ppi->lap_enabled == 0) {
            auVar7._8_8_ = 0;
            auVar7._0_8_ = (oxcf->twopass_stats_in).sz >> 3;
            ext_stats_buf = (FIRSTPASS_STATS *)(oxcf->twopass_stats_in).buf;
            ((cpi_00->ppi->twopass).stats_buf_ctx)->stats_in_start = ext_stats_buf;
            (cpi_00->twopass_frame).stats_in =
                 ((cpi_00->ppi->twopass).stats_buf_ctx)->stats_in_start;
            iVar8 = SUB164(auVar7 * ZEXT816(0x8d3dcb08d3dcb09),8) + -1;
            ((cpi_00->ppi->twopass).stats_buf_ctx)->stats_in_end =
                 ((cpi_00->ppi->twopass).stats_buf_ctx)->stats_in_start + iVar8;
            av1_firstpass_info_init(&(cpi_00->ppi->twopass).firstpass_info,ext_stats_buf,iVar8);
            av1_init_second_pass(cpi_00);
          }
          else {
            av1_firstpass_info_init(&(cpi_00->ppi->twopass).firstpass_info,(FIRSTPASS_STATS *)0x0,0)
            ;
            av1_init_single_pass_lap(cpi_00);
          }
        }
        if ((cpi_00->oxcf).kf_cfg.key_freq_max != 0) {
          paVar9 = (cpi_00->common).error;
          piVar12 = (int32_t *)aom_memalign(0x10,0x10000);
          (cpi_00->td).mb.obmc_buffer.wsrc = piVar12;
          if (piVar12 == (int32_t *)0x0) {
            aom_internal_error(paVar9,AOM_CODEC_MEM_ERROR,"Failed to allocate obmc_buffer->wsrc");
          }
          piVar12 = (int32_t *)aom_memalign(0x10,0x10000);
          (cpi_00->td).mb.obmc_buffer.mask = piVar12;
          if (piVar12 == (int32_t *)0x0) {
            aom_internal_error(paVar9,AOM_CODEC_MEM_ERROR,"Failed to allocate obmc_buffer->mask");
          }
          puVar13 = (uint8_t *)aom_memalign(0x10,0xc000);
          (cpi_00->td).mb.obmc_buffer.above_pred = puVar13;
          if (puVar13 == (uint8_t *)0x0) {
            aom_internal_error(paVar9,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate obmc_buffer->above_pred");
          }
          puVar13 = (uint8_t *)aom_memalign(0x10,0xc000);
          (cpi_00->td).mb.obmc_buffer.left_pred = puVar13;
          if (puVar13 == (uint8_t *)0x0) {
            aom_internal_error(paVar9,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate obmc_buffer->left_pred");
          }
        }
        lVar14 = 0x33e88;
        lVar17 = 0;
        do {
          lVar19 = 1;
          lVar18 = lVar14;
          do {
            pvVar15 = aom_malloc(0x4000);
            *(void **)((long)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1) + lVar18) =
                 pvVar15;
            if (*(long *)((long)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1) + lVar18)
                == 0) {
              aom_internal_error((cpi_00->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate cpi->td.mb.intrabc_hash_info.hash_value_buffer[x][y]"
                                );
            }
            lVar18 = lVar18 + 8;
            lVar19 = lVar19 + -1;
          } while (lVar19 == 0);
          lVar14 = lVar14 + 0x10;
          bVar20 = lVar17 == 0;
          lVar17 = lVar17 + 1;
        } while (bVar20);
        (cpi_00->td).mb.intrabc_hash_info.g_crc_initialized = 0;
        av1_set_speed_features_framesize_independent(cpi_00,oxcf->speed);
        av1_set_speed_features_framesize_dependent(cpi_00,oxcf->speed);
        uVar2 = (oxcf->frm_dim_cfg).forced_max_frame_width;
        uVar3 = (oxcf->frm_dim_cfg).forced_max_frame_height;
        uVar21 = ~-(uint)(uVar3 == 0) & uVar3 + 7 >> 2 & 0xfffffffe |
                 (cpi_00->common).mi_params.mi_rows & -(uint)(uVar3 == 0);
        uVar23 = ~-(uint)(uVar2 == 0) & uVar2 + 7 >> 2 & 0xfffffffe |
                 (cpi_00->common).mi_params.mi_cols & -(uint)(uVar2 == 0);
        iVar8 = (int)(uVar23 * uVar21) >> 2;
        puVar13 = (uint8_t *)aom_calloc((long)iVar8,1);
        cpi_00->consec_zero_mv = puVar13;
        if (cpi_00->consec_zero_mv == (uint8_t *)0x0) {
          aom_internal_error((cpi_00->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cpi->consec_zero_mv");
        }
        cpi_00->consec_zero_mv_alloc_size = iVar8;
        cpi_00->mb_weber_stats = (WeberStats *)0x0;
        cpi_00->mb_delta_q = (int *)0x0;
        cpi_00->palette_pixel_num = 0;
        cpi_00->scaled_last_source_available = 0;
        iVar8 = uVar21 + 3;
        iVar22 = uVar23 + 3;
        num = (size_t)(((int)(((uint)(iVar22 >> 0x1f) >> 0x1e) + iVar22) >> 2) *
                      ((int)(((uint)(iVar8 >> 0x1f) >> 0x1e) + iVar8) >> 2));
        pdVar16 = (double *)aom_calloc(num,8);
        cpi_00->ssim_rdmult_scaling_factors = pdVar16;
        if (cpi_00->ssim_rdmult_scaling_factors == (double *)0x0) {
          aom_internal_error((cpi_00->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cpi->ssim_rdmult_scaling_factors");
        }
        pdVar16 = (double *)aom_calloc(num,8);
        cpi_00->tpl_rdmult_scaling_factors = pdVar16;
        if (cpi_00->tpl_rdmult_scaling_factors == (double *)0x0) {
          aom_internal_error((cpi_00->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cpi->tpl_rdmult_scaling_factors");
        }
        (cpi_00->enc_quant_dequant_params).prev_deltaq_params.y_dc_delta_q = 0x7fffffff;
        (cpi_00->enc_quant_dequant_params).prev_deltaq_params.u_dc_delta_q = 0x7fffffff;
        (cpi_00->enc_quant_dequant_params).prev_deltaq_params.u_ac_delta_q = 0x7fffffff;
        (cpi_00->enc_quant_dequant_params).prev_deltaq_params.v_dc_delta_q = 0x7fffffff;
        (cpi_00->enc_quant_dequant_params).prev_deltaq_params.v_ac_delta_q = 0x7fffffff;
        av1_init_quantizer(&cpi_00->enc_quant_dequant_params,&(cpi_00->common).quant_params,
                           ((cpi_00->common).seq_params)->bit_depth,
                           (cpi_00->oxcf).algo_cfg.sharpness);
        av1_qm_init(&(cpi_00->common).quant_params,
                    (uint)(((cpi_00->common).seq_params)->monochrome == '\0') * 2 + 1);
        av1_loop_filter_init(&cpi_00->common);
        (cpi_00->common).superres_scale_denominator = '\b';
        (cpi_00->common).superres_upscaled_width = (oxcf->frm_dim_cfg).width;
        (cpi_00->common).superres_upscaled_height = (oxcf->frm_dim_cfg).height;
        av1_loop_restoration_precal();
        cpi_00->second_pass_log_stream = (FILE *)0x0;
        cpi_00->use_ducky_encode = 0;
        ((cpi_00->common).error)->setjmp = 0;
        return cpi_00;
      }
      paVar9->setjmp = 0;
      av1_remove_compressor(cpi_00);
    }
  }
  return (AV1_COMP *)0x0;
}

Assistant:

AV1_COMP *av1_create_compressor(AV1_PRIMARY *ppi, const AV1EncoderConfig *oxcf,
                                BufferPool *const pool, COMPRESSOR_STAGE stage,
                                int lap_lag_in_frames) {
  AV1_COMP *volatile const cpi = aom_memalign(32, sizeof(AV1_COMP));

  if (!cpi) return NULL;

  av1_zero(*cpi);

  cpi->ppi = ppi;

  AV1_COMMON *volatile const cm = &cpi->common;
  cm->seq_params = &ppi->seq_params;
  cm->error =
      (struct aom_internal_error_info *)aom_calloc(1, sizeof(*cm->error));
  if (!cm->error) {
    aom_free(cpi);
    return NULL;
  }

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(cm->error->jmp)) {
    cm->error->setjmp = 0;
    av1_remove_compressor(cpi);
    return NULL;
  }

  cm->error->setjmp = 1;
  cpi->compressor_stage = stage;

  cpi->do_frame_data_update = true;

  CommonModeInfoParams *const mi_params = &cm->mi_params;
  mi_params->free_mi = enc_free_mi;
  mi_params->setup_mi = enc_setup_mi;
  mi_params->set_mb_mi =
      (oxcf->pass == AOM_RC_FIRST_PASS || cpi->compressor_stage == LAP_STAGE)
          ? stat_stage_set_mb_mi
          : enc_set_mb_mi;

  mi_params->mi_alloc_bsize = BLOCK_4X4;

  CHECK_MEM_ERROR(cm, cm->fc,
                  (FRAME_CONTEXT *)aom_memalign(32, sizeof(*cm->fc)));
  CHECK_MEM_ERROR(
      cm, cm->default_frame_context,
      (FRAME_CONTEXT *)aom_memalign(32, sizeof(*cm->default_frame_context)));
  memset(cm->fc, 0, sizeof(*cm->fc));
  memset(cm->default_frame_context, 0, sizeof(*cm->default_frame_context));

  cpi->common.buffer_pool = pool;

  init_config(cpi, oxcf);
  if (cpi->compressor_stage == LAP_STAGE) {
    cpi->oxcf.gf_cfg.lag_in_frames = lap_lag_in_frames;
  }

  av1_rc_init(&cpi->oxcf, &cpi->rc);

  init_frame_info(&cpi->frame_info, cm);
  init_frame_index_set(&cpi->frame_index_set);

  cm->current_frame.frame_number = 0;
  cpi->rc.frame_number_encoded = 0;
  cpi->rc.prev_frame_is_dropped = 0;
  cpi->rc.max_consec_drop = INT_MAX;
  cpi->rc.drop_count_consec = 0;
  cm->current_frame_id = -1;
  cpi->tile_data = NULL;
  cpi->last_show_frame_buf = NULL;
  realloc_segmentation_maps(cpi);

  cpi->refresh_frame.alt_ref_frame = false;

#if CONFIG_SPEED_STATS
  cpi->tx_search_count = 0;
#endif  // CONFIG_SPEED_STATS

  cpi->time_stamps.first_ts_start = INT64_MAX;

#ifdef OUTPUT_YUV_REC
  yuv_rec_file = fopen("rec.yuv", "wb");
#endif
#ifdef OUTPUT_YUV_DENOISED
  yuv_denoised_file = fopen("denoised.yuv", "wb");
#endif

#if !CONFIG_REALTIME_ONLY
  if (is_stat_consumption_stage(cpi)) {
    const size_t packet_sz = sizeof(FIRSTPASS_STATS);
    const int packets = (int)(oxcf->twopass_stats_in.sz / packet_sz);

    if (!cpi->ppi->lap_enabled) {
      /*Re-initialize to stats buffer, populated by application in the case of
       * two pass*/
      cpi->ppi->twopass.stats_buf_ctx->stats_in_start =
          oxcf->twopass_stats_in.buf;
      cpi->twopass_frame.stats_in =
          cpi->ppi->twopass.stats_buf_ctx->stats_in_start;
      cpi->ppi->twopass.stats_buf_ctx->stats_in_end =
          &cpi->ppi->twopass.stats_buf_ctx->stats_in_start[packets - 1];

      // The buffer size is packets - 1 because the last packet is total_stats.
      av1_firstpass_info_init(&cpi->ppi->twopass.firstpass_info,
                              oxcf->twopass_stats_in.buf, packets - 1);
      av1_init_second_pass(cpi);
    } else {
      av1_firstpass_info_init(&cpi->ppi->twopass.firstpass_info, NULL, 0);
      av1_init_single_pass_lap(cpi);
    }
  }
#endif

  // The buffer "obmc_buffer" is used in inter frames for fast obmc search.
  // Hence, the memory allocation for the same is avoided for allintra encoding
  // mode.
  if (cpi->oxcf.kf_cfg.key_freq_max != 0)
    alloc_obmc_buffers(&cpi->td.mb.obmc_buffer, cm->error);

  for (int x = 0; x < 2; x++)
    for (int y = 0; y < 2; y++)
      CHECK_MEM_ERROR(
          cm, cpi->td.mb.intrabc_hash_info.hash_value_buffer[x][y],
          (uint32_t *)aom_malloc(
              AOM_BUFFER_SIZE_FOR_BLOCK_HASH *
              sizeof(*cpi->td.mb.intrabc_hash_info.hash_value_buffer[0][0])));

  cpi->td.mb.intrabc_hash_info.g_crc_initialized = 0;

  av1_set_speed_features_framesize_independent(cpi, oxcf->speed);
  av1_set_speed_features_framesize_dependent(cpi, oxcf->speed);

  int max_mi_cols = mi_params->mi_cols;
  int max_mi_rows = mi_params->mi_rows;
  if (oxcf->frm_dim_cfg.forced_max_frame_width) {
    max_mi_cols = size_in_mi(oxcf->frm_dim_cfg.forced_max_frame_width);
  }
  if (oxcf->frm_dim_cfg.forced_max_frame_height) {
    max_mi_rows = size_in_mi(oxcf->frm_dim_cfg.forced_max_frame_height);
  }

  const int consec_zero_mv_alloc_size = (max_mi_rows * max_mi_cols) >> 2;
  CHECK_MEM_ERROR(
      cm, cpi->consec_zero_mv,
      aom_calloc(consec_zero_mv_alloc_size, sizeof(*cpi->consec_zero_mv)));
  cpi->consec_zero_mv_alloc_size = consec_zero_mv_alloc_size;

  cpi->mb_weber_stats = NULL;
  cpi->mb_delta_q = NULL;
  cpi->palette_pixel_num = 0;
  cpi->scaled_last_source_available = 0;

  {
    const BLOCK_SIZE bsize = BLOCK_16X16;
    const int w = mi_size_wide[bsize];
    const int h = mi_size_high[bsize];
    const int num_cols = (max_mi_cols + w - 1) / w;
    const int num_rows = (max_mi_rows + h - 1) / h;
    CHECK_MEM_ERROR(cm, cpi->ssim_rdmult_scaling_factors,
                    aom_calloc(num_rows * num_cols,
                               sizeof(*cpi->ssim_rdmult_scaling_factors)));
    CHECK_MEM_ERROR(cm, cpi->tpl_rdmult_scaling_factors,
                    aom_calloc(num_rows * num_cols,
                               sizeof(*cpi->tpl_rdmult_scaling_factors)));
  }

#if CONFIG_TUNE_VMAF
  {
    const BLOCK_SIZE bsize = BLOCK_64X64;
    const int w = mi_size_wide[bsize];
    const int h = mi_size_high[bsize];
    const int num_cols = (mi_params->mi_cols + w - 1) / w;
    const int num_rows = (mi_params->mi_rows + h - 1) / h;
    CHECK_MEM_ERROR(cm, cpi->vmaf_info.rdmult_scaling_factors,
                    aom_calloc(num_rows * num_cols,
                               sizeof(*cpi->vmaf_info.rdmult_scaling_factors)));
    for (int i = 0; i < MAX_ARF_LAYERS; i++) {
      cpi->vmaf_info.last_frame_unsharp_amount[i] = -1.0;
      cpi->vmaf_info.last_frame_ysse[i] = -1.0;
      cpi->vmaf_info.last_frame_vmaf[i] = -1.0;
    }
    cpi->vmaf_info.original_qindex = -1;
    cpi->vmaf_info.vmaf_model = NULL;
  }
#endif

#if CONFIG_TUNE_BUTTERAUGLI
  {
    const int w = mi_size_wide[butteraugli_rdo_bsize];
    const int h = mi_size_high[butteraugli_rdo_bsize];
    const int num_cols = (mi_params->mi_cols + w - 1) / w;
    const int num_rows = (mi_params->mi_rows + h - 1) / h;
    CHECK_MEM_ERROR(
        cm, cpi->butteraugli_info.rdmult_scaling_factors,
        aom_malloc(num_rows * num_cols *
                   sizeof(*cpi->butteraugli_info.rdmult_scaling_factors)));
    memset(&cpi->butteraugli_info.source, 0,
           sizeof(cpi->butteraugli_info.source));
    memset(&cpi->butteraugli_info.resized_source, 0,
           sizeof(cpi->butteraugli_info.resized_source));
    cpi->butteraugli_info.recon_set = false;
  }
#endif

#if CONFIG_SALIENCY_MAP
  {
    CHECK_MEM_ERROR(cm, cpi->saliency_map,
                    (uint8_t *)aom_calloc(cm->height * cm->width,
                                          sizeof(*cpi->saliency_map)));
    // Buffer initialization based on MIN_MIB_SIZE_LOG2 to ensure that
    // cpi->sm_scaling_factor buffer is allocated big enough, since we have no
    // idea of the actual superblock size we are going to use yet.
    const int min_mi_w_sb = (1 << MIN_MIB_SIZE_LOG2);
    const int min_mi_h_sb = (1 << MIN_MIB_SIZE_LOG2);
    const int max_sb_cols =
        (cm->mi_params.mi_cols + min_mi_w_sb - 1) / min_mi_w_sb;
    const int max_sb_rows =
        (cm->mi_params.mi_rows + min_mi_h_sb - 1) / min_mi_h_sb;
    CHECK_MEM_ERROR(cm, cpi->sm_scaling_factor,
                    (double *)aom_calloc(max_sb_rows * max_sb_cols,
                                         sizeof(*cpi->sm_scaling_factor)));
  }
#endif

#if CONFIG_COLLECT_PARTITION_STATS
  av1_zero(cpi->partition_stats);
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Initialize the members of DeltaQuantParams with INT_MAX to ensure that
  // the quantizer tables are correctly initialized using the default deltaq
  // parameters when av1_init_quantizer is called for the first time.
  DeltaQuantParams *const prev_deltaq_params =
      &cpi->enc_quant_dequant_params.prev_deltaq_params;
  prev_deltaq_params->y_dc_delta_q = INT_MAX;
  prev_deltaq_params->u_dc_delta_q = INT_MAX;
  prev_deltaq_params->v_dc_delta_q = INT_MAX;
  prev_deltaq_params->u_ac_delta_q = INT_MAX;
  prev_deltaq_params->v_ac_delta_q = INT_MAX;

  av1_init_quantizer(&cpi->enc_quant_dequant_params, &cm->quant_params,
                     cm->seq_params->bit_depth, cpi->oxcf.algo_cfg.sharpness);
  av1_qm_init(&cm->quant_params, av1_num_planes(cm));

  av1_loop_filter_init(cm);
  cm->superres_scale_denominator = SCALE_NUMERATOR;
  cm->superres_upscaled_width = oxcf->frm_dim_cfg.width;
  cm->superres_upscaled_height = oxcf->frm_dim_cfg.height;
#if !CONFIG_REALTIME_ONLY
  av1_loop_restoration_precal();
#endif

#if CONFIG_THREE_PASS
  cpi->third_pass_ctx = NULL;
  if (cpi->oxcf.pass == AOM_RC_THIRD_PASS) {
    av1_init_thirdpass_ctx(cm, &cpi->third_pass_ctx, NULL);
  }
#endif

  cpi->second_pass_log_stream = NULL;
  cpi->use_ducky_encode = 0;

  cm->error->setjmp = 0;
  return cpi;
}